

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc.c++
# Opt level: O0

void __thiscall
capnp::EzRpcServer::Impl::Impl
          (Impl *this,Client *mainInterface,StringPtr bindAddress,uint defaultPort,
          ReaderOptions readerOpts)

{
  int iVar1;
  Client *pCVar2;
  EzRpcContext *this_00;
  AsyncIoProvider *pAVar3;
  undefined4 extraout_var;
  Own<kj::PromiseFulfiller<unsigned_int>_> local_e8;
  int local_d8;
  CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_ez_rpc_c__:264:11),_kj::Own<kj::PromiseFulfiller<unsigned_int>_>_>
  local_d0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined1 local_90 [16];
  Promise<void> local_80;
  ForkedPromise<unsigned_int> local_70;
  undefined1 local_60 [8];
  PromiseFulfillerPair<unsigned_int> paf;
  uint defaultPort_local;
  Client *mainInterface_local;
  Impl *this_local;
  StringPtr bindAddress_local;
  
  SturdyRefRestorer<capnp::AnyPointer>::SturdyRefRestorer
            (&this->super_SturdyRefRestorer<capnp::AnyPointer>);
  kj::TaskSet::ErrorHandler::ErrorHandler(&this->super_ErrorHandler);
  (this->super_SturdyRefRestorer<capnp::AnyPointer>).super_SturdyRefRestorerBase.
  _vptr_SturdyRefRestorerBase = (_func_int **)&PTR_baseRestore_00cd7b80;
  (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)&DAT_00cd7ba8;
  pCVar2 = kj::mv<capnp::Capability::Client>(mainInterface);
  Capability::Client::Client(&this->mainInterface,pCVar2);
  EzRpcContext::getThreadLocal();
  std::
  map<kj::StringPtr,_capnp::EzRpcServer::Impl::ExportedCap,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::EzRpcServer::Impl::ExportedCap>_>_>
  ::map(&this->exportMap);
  kj::ForkedPromise<unsigned_int>::ForkedPromise(&this->portPromise,(void *)0x0);
  kj::TaskSet::TaskSet(&this->tasks,&this->super_ErrorHandler);
  kj::newPromiseAndFulfiller<unsigned_int>();
  kj::Promise<unsigned_int>::fork((Promise<unsigned_int> *)&local_70);
  kj::ForkedPromise<unsigned_int>::operator=(&this->portPromise,&local_70);
  kj::ForkedPromise<unsigned_int>::~ForkedPromise(&local_70);
  this_00 = kj::Own<capnp::EzRpcContext>::operator->(&this->context);
  pAVar3 = EzRpcContext::getIoProvider(this_00);
  iVar1 = (*pAVar3->_vptr_AsyncIoProvider[3])();
  this_local._0_4_ = bindAddress.content.ptr._0_4_;
  this_local._4_4_ = bindAddress.content.ptr._4_4_;
  bindAddress_local.content.ptr._0_4_ = (undefined4)bindAddress.content.size_;
  bindAddress_local.content.ptr._4_4_ = bindAddress.content.size_._4_4_;
  local_a8 = this_local._0_4_;
  uStack_a4 = this_local._4_4_;
  uStack_a0 = bindAddress_local.content.ptr._0_4_;
  uStack_9c = bindAddress_local.content.ptr._4_4_;
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar1))
            (local_90,(undefined8 *)CONCAT44(extraout_var,iVar1),bindAddress.content.ptr,
             bindAddress.content.size_,defaultPort);
  local_d8 = readerOpts.nestingLimit;
  local_e8.ptr = (PromiseFulfiller<unsigned_int> *)readerOpts.traversalLimitInWords;
  local_e8.disposer = (Disposer *)this;
  kj::
  mvCapture<capnp::EzRpcServer::Impl::Impl(capnp::Capability::Client,kj::StringPtr,unsigned_int,capnp::ReaderOptions)::_lambda(kj::Own<kj::PromiseFulfiller<unsigned_int>>&&,kj::Own<kj::NetworkAddress>&&)_1_,kj::Own<kj::PromiseFulfiller<unsigned_int>>&>
            (&local_d0,(kj *)&paf.promise.super_PromiseBase.node.ptr,&local_e8,
             (Type *)(ulong)(uint)readerOpts.nestingLimit);
  kj::Promise<kj::Own<kj::NetworkAddress>>::
  then<kj::CaptureByMove<capnp::EzRpcServer::Impl::Impl(capnp::Capability::Client,kj::StringPtr,unsigned_int,capnp::ReaderOptions)::_lambda(kj::Own<kj::PromiseFulfiller<unsigned_int>>&&,kj::Own<kj::NetworkAddress>&&)_1_,kj::Own<kj::PromiseFulfiller<unsigned_int>>>,kj::_::PropagateException>
            ((Promise<kj::Own<kj::NetworkAddress>> *)&local_80,
             (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_ez_rpc_c__:264:11),_kj::Own<kj::PromiseFulfiller<unsigned_int>_>_>
              *)local_90,(PropagateException *)&local_d0);
  kj::TaskSet::add(&this->tasks,&local_80);
  kj::Promise<void>::~Promise(&local_80);
  kj::
  CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc.c++:264:11),_kj::Own<kj::PromiseFulfiller<unsigned_int>_>_>
  ::~CaptureByMove(&local_d0);
  kj::Promise<kj::Own<kj::NetworkAddress>_>::~Promise
            ((Promise<kj::Own<kj::NetworkAddress>_> *)local_90);
  kj::PromiseFulfillerPair<unsigned_int>::~PromiseFulfillerPair
            ((PromiseFulfillerPair<unsigned_int> *)local_60);
  return;
}

Assistant:

Impl(Capability::Client mainInterface, kj::StringPtr bindAddress, uint defaultPort,
       ReaderOptions readerOpts)
      : mainInterface(kj::mv(mainInterface)),
        context(EzRpcContext::getThreadLocal()), portPromise(nullptr), tasks(*this) {
    auto paf = kj::newPromiseAndFulfiller<uint>();
    portPromise = paf.promise.fork();

    tasks.add(context->getIoProvider().getNetwork().parseAddress(bindAddress, defaultPort)
        .then(kj::mvCapture(paf.fulfiller,
          [this, readerOpts](kj::Own<kj::PromiseFulfiller<uint>>&& portFulfiller,
                             kj::Own<kj::NetworkAddress>&& addr) {
      auto listener = addr->listen();
      portFulfiller->fulfill(listener->getPort());
      acceptLoop(kj::mv(listener), readerOpts);
    })));
  }